

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.hpp
# Opt level: O2

void __thiscall
re::beatnik::viterbi<float,_256L>::calculate_transition
          (viterbi<float,_256L> *this,span<const_float,_256L> input)

{
  long lVar1;
  int i;
  ulong permutation;
  long lVar2;
  array<float,_256UL> *paVar3;
  array<long,_256UL> *paVar4;
  uint uVar5;
  pair<long,_float> pVar6;
  array<float,_128UL> temp;
  float afStack_230 [128];
  
  paVar3 = &this->delta;
  paVar4 = &this->psi;
  permutation = 0;
  lVar2 = 0;
  do {
    if (permutation == 0x180) {
      return;
    }
    uVar5 = (uint)permutation & 0x7f;
    if (permutation < 0x80) {
LAB_0010546f:
      pVar6 = max_delta_element(this,permutation);
      paVar4->_M_elems[0] = pVar6.first;
      paVar4 = (array<long,_256UL> *)(paVar4->_M_elems + 1);
      afStack_230[uVar5] = pVar6.second;
    }
    else {
      lVar1 = lVar2 * 4;
      lVar2 = lVar2 + 1;
      paVar3->_M_elems[0] = *(float *)((long)input.storage_.data_ + lVar1) * afStack_230[uVar5];
      paVar3 = (array<float,_256UL> *)(paVar3->_M_elems + 1);
      if (permutation < 0x100) goto LAB_0010546f;
    }
    permutation = permutation + 1;
  } while( true );
}

Assistant:

void
    calculate_transition(gsl::span<T const, N> input) noexcept
    {
        auto delta_it = std::begin(delta);
        auto psi_it = std::begin(psi);
        auto input_it = std::cbegin(input);

        std::array<T, radius> temp;

        for (auto i = 0; i < 3 * radius; i++) {
            auto m = i % radius;
            if (i >= radius) {
                *(delta_it++) = *(input_it++) * temp[m];
            }
            if (i < N) {
                auto max_el = max_delta_element(i);
                *(psi_it++) = max_el.first; // index
                temp[m] = max_el.second; // value
            }
        }
    }